

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O2

void __thiscall
jsoncons::not_an_object::not_an_object<char>(not_an_object *this,char *key,size_t length)

{
  *(undefined ***)&this->field_0x50 = &PTR__json_exception_00997168;
  std::runtime_error::runtime_error
            (&this->super_runtime_error,
             "Attempting to access a member of a value that is not an object");
  *(undefined8 *)this = 0x998f10;
  *(undefined8 *)&this->field_0x50 = 0x998f48;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  unicode_traits::convert<char,std::__cxx11::string>(key,length,&this->name_,strict);
  return;
}

Assistant:

explicit not_an_object(const CharT* key, std::size_t length) noexcept
            : std::runtime_error("Attempting to access a member of a value that is not an object")
        {
            JSONCONS_TRY
            {
                unicode_traits::convert(key, length, name_,
                                 unicode_traits::conv_flags::strict);
            }